

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

deInt64 tcu::computeSquaredDiffSum
                  (ConstPixelBufferAccess *ref,ConstPixelBufferAccess *cmp,
                  PixelBufferAccess *diffMask,int diffFactor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  int iVar7;
  int iVar8;
  TextureFormat *pTVar9;
  InternalError *this;
  int *piVar10;
  RGBA local_a4;
  Vec4 local_a0;
  int local_90;
  int local_8c;
  int sqSum;
  int sum;
  undefined1 local_78 [8];
  IVec4 diff;
  IVec4 b;
  IVec4 a;
  int x;
  int y;
  deInt64 diffSum;
  int diffFactor_local;
  PixelBufferAccess *diffMask_local;
  ConstPixelBufferAccess *cmp_local;
  ConstPixelBufferAccess *ref_local;
  
  while( true ) {
    dVar6 = ::deGetFalse();
    if (dVar6 != 0) break;
    pTVar9 = ConstPixelBufferAccess::getFormat(ref);
    if (pTVar9->type != UNORM_INT8) break;
    pTVar9 = ConstPixelBufferAccess::getFormat(cmp);
    if (pTVar9->type != UNORM_INT8) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      _x = 0;
      a.m_data[3] = 0;
      while( true ) {
        iVar7 = ConstPixelBufferAccess::getHeight(cmp);
        if (iVar7 <= a.m_data[3]) break;
        a.m_data[2] = 0;
        while( true ) {
          iVar7 = ConstPixelBufferAccess::getWidth(cmp);
          if (iVar7 <= a.m_data[2]) break;
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)(b.m_data + 2),(int)ref,a.m_data[2],a.m_data[3]);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)cmp,a.m_data[2],a.m_data[3]);
          operator-((tcu *)&sqSum,(Vector<int,_4> *)(b.m_data + 2),
                    (Vector<int,_4> *)(diff.m_data + 2));
          abs<int,4>((tcu *)local_78,(Vector<int,_4> *)&sqSum);
          piVar10 = Vector<int,_4>::x((Vector<int,_4> *)local_78);
          iVar7 = *piVar10;
          piVar10 = Vector<int,_4>::y((Vector<int,_4> *)local_78);
          iVar8 = *piVar10;
          piVar10 = Vector<int,_4>::z((Vector<int,_4> *)local_78);
          iVar1 = *piVar10;
          piVar10 = Vector<int,_4>::w((Vector<int,_4> *)local_78);
          local_8c = iVar7 + iVar8 + iVar1 + *piVar10;
          piVar10 = Vector<int,_4>::x((Vector<int,_4> *)local_78);
          iVar7 = *piVar10;
          piVar10 = Vector<int,_4>::x((Vector<int,_4> *)local_78);
          iVar8 = *piVar10;
          piVar10 = Vector<int,_4>::y((Vector<int,_4> *)local_78);
          iVar1 = *piVar10;
          piVar10 = Vector<int,_4>::y((Vector<int,_4> *)local_78);
          iVar2 = *piVar10;
          piVar10 = Vector<int,_4>::z((Vector<int,_4> *)local_78);
          iVar3 = *piVar10;
          piVar10 = Vector<int,_4>::z((Vector<int,_4> *)local_78);
          iVar4 = *piVar10;
          piVar10 = Vector<int,_4>::w((Vector<int,_4> *)local_78);
          iVar5 = *piVar10;
          piVar10 = Vector<int,_4>::w((Vector<int,_4> *)local_78);
          local_90 = iVar7 * iVar8 + iVar1 * iVar2 + iVar3 * iVar4 + iVar5 * *piVar10;
          iVar7 = deClamp32(local_8c * diffFactor,0,0xff);
          iVar8 = deClamp32(0xff - local_8c * diffFactor,0,0xff);
          RGBA::RGBA(&local_a4,iVar7,iVar8,0,0xff);
          RGBA::toVec((RGBA *)&local_a0);
          PixelBufferAccess::setPixel(diffMask,&local_a0,a.m_data[2],a.m_data[3],0);
          _x = local_90 + _x;
          a.m_data[2] = a.m_data[2] + 1;
        }
        a.m_data[3] = a.m_data[3] + 1;
      }
      return _x;
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,
             "ref.getFormat().type == TextureFormat::UNORM_INT8 && cmp.getFormat().type == TextureFormat::UNORM_INT8"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
             ,0x125);
  __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

static deInt64 computeSquaredDiffSum (const ConstPixelBufferAccess& ref, const ConstPixelBufferAccess& cmp, const PixelBufferAccess& diffMask, int diffFactor)
{
	TCU_CHECK_INTERNAL(ref.getFormat().type == TextureFormat::UNORM_INT8 && cmp.getFormat().type == TextureFormat::UNORM_INT8);
	DE_ASSERT(ref.getWidth() == cmp.getWidth() && ref.getWidth() == diffMask.getWidth());
	DE_ASSERT(ref.getHeight() == cmp.getHeight() && ref.getHeight() == diffMask.getHeight());

	deInt64 diffSum = 0;

	for (int y = 0; y < cmp.getHeight(); y++)
	{
		for (int x = 0; x < cmp.getWidth(); x++)
		{
			IVec4	a		= ref.getPixelInt(x, y);
			IVec4	b		= cmp.getPixelInt(x, y);
			IVec4	diff	= abs(a - b);
			int		sum		= diff.x() + diff.y() + diff.z() + diff.w();
			int		sqSum	= diff.x()*diff.x() + diff.y()*diff.y() + diff.z()*diff.z() + diff.w()*diff.w();

			diffMask.setPixel(tcu::RGBA(deClamp32(sum*diffFactor, 0, 255), deClamp32(255-sum*diffFactor, 0, 255), 0, 255).toVec(), x, y);

			diffSum += (deInt64)sqSum;
		}
	}

	return diffSum;
}